

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O0

bool __thiscall google::protobuf::io::Tokenizer::TryConsumeNewline(Tokenizer *this)

{
  bool bVar1;
  Tokenizer *this_local;
  
  if (((this->report_whitespace_ & 1U) == 0) || ((this->report_newlines_ & 1U) == 0)) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = TryConsume(this,'\n');
    if (bVar1) {
      (this->current_).type = TYPE_NEWLINE;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Tokenizer::TryConsumeNewline() {
  if (!report_whitespace_ || !report_newlines_) {
    return false;
  }
  if (TryConsume('\n')) {
    current_.type = TYPE_NEWLINE;
    return true;
  }
  return false;
}